

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

BasicBlock * __thiscall spvtools::opt::Loop::FindLatchBlock(Loop *this)

{
  uint32_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t a;
  CFG *this_00;
  DominatorTree *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  BasicBlock *pBVar5;
  uint32_t *puVar6;
  
  this_00 = IRContext::cfg(this->context_);
  this_01 = (DominatorTree *)
            IRContext::GetDominatorAnalysis(this->context_,this->loop_header_->function_);
  uVar3 = BasicBlock::id(this->loop_header_);
  pvVar4 = CFG::preds(this_00,uVar3);
  puVar6 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar1) {
      __assert_fail("false && \"Every loop should have a latch block dominated by the continue target\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                    ,0x15c,"BasicBlock *spvtools::opt::Loop::FindLatchBlock()");
    }
    uVar3 = *puVar6;
    a = BasicBlock::id(this->loop_continue_);
    bVar2 = DominatorTree::Dominates(this_01,a,uVar3);
    puVar6 = puVar6 + 1;
  } while (!bVar2);
  pBVar5 = CFG::block(this_00,uVar3);
  return pBVar5;
}

Assistant:

BasicBlock* Loop::FindLatchBlock() {
  CFG* cfg = context_->cfg();

  DominatorAnalysis* dominator_analysis =
      context_->GetDominatorAnalysis(loop_header_->GetParent());

  // Look at the predecessors of the loop header to find a predecessor block
  // which is dominated by the loop continue target. There should only be one
  // block which meets this criteria and this is the latch block, as per the
  // SPIR-V spec.
  for (uint32_t block_id : cfg->preds(loop_header_->id())) {
    if (dominator_analysis->Dominates(loop_continue_->id(), block_id)) {
      return cfg->block(block_id);
    }
  }

  assert(
      false &&
      "Every loop should have a latch block dominated by the continue target");
  return nullptr;
}